

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

size_t __thiscall slang::syntax::SyntaxNode::getChildCount(SyntaxNode *this)

{
  logic_error *this_00;
  string local_f0;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  SyntaxNode *local_18;
  SyntaxNode *this_local;
  
  local_18 = this;
  switch(this->kind) {
  case Unknown:
    this_local = (SyntaxNode *)0x0;
    break;
  case SyntaxList:
  case TokenList:
  case SeparatedList:
    this_local = (SyntaxNode *)SyntaxListBase::getChildCount((SyntaxListBase *)&this[-1].kind);
    break;
  case AcceptOnPropertyExpr:
    this_local = (SyntaxNode *)0x5;
    break;
  case ActionBlock:
    this_local = (SyntaxNode *)0x2;
    break;
  case AddAssignmentExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case AddExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case AlwaysBlock:
    this_local = (SyntaxNode *)0x3;
    break;
  case AlwaysCombBlock:
    this_local = (SyntaxNode *)0x3;
    break;
  case AlwaysFFBlock:
    this_local = (SyntaxNode *)0x3;
    break;
  case AlwaysLatchBlock:
    this_local = (SyntaxNode *)0x3;
    break;
  case AndAssignmentExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case AndPropertyExpr:
    this_local = (SyntaxNode *)0x3;
    break;
  case AndSequenceExpr:
    this_local = (SyntaxNode *)0x3;
    break;
  case AnsiPortList:
    this_local = (SyntaxNode *)0x3;
    break;
  case AnsiUdpPortList:
    this_local = (SyntaxNode *)0x4;
    break;
  case ArgumentList:
    this_local = (SyntaxNode *)0x3;
    break;
  case ArithmeticLeftShiftAssignmentExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case ArithmeticRightShiftAssignmentExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case ArithmeticShiftLeftExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case ArithmeticShiftRightExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case ArrayAndMethod:
    this_local = (SyntaxNode *)0x1;
    break;
  case ArrayOrMethod:
    this_local = (SyntaxNode *)0x1;
    break;
  case ArrayOrRandomizeMethodExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case ArrayUniqueMethod:
    this_local = (SyntaxNode *)0x1;
    break;
  case ArrayXorMethod:
    this_local = (SyntaxNode *)0x1;
    break;
  case AscendingRangeSelect:
    this_local = (SyntaxNode *)0x3;
    break;
  case AssertPropertyStatement:
    this_local = (SyntaxNode *)0x8;
    break;
  case AssertionItemPort:
    this_local = (SyntaxNode *)0x7;
    break;
  case AssertionItemPortList:
    this_local = (SyntaxNode *)0x3;
    break;
  case AssignmentExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case AssignmentPatternExpression:
    this_local = (SyntaxNode *)0x2;
    break;
  case AssignmentPatternItem:
    this_local = (SyntaxNode *)0x3;
    break;
  case AssumePropertyStatement:
    this_local = (SyntaxNode *)0x8;
    break;
  case AttributeInstance:
    this_local = (SyntaxNode *)0x3;
    break;
  case AttributeSpec:
    this_local = (SyntaxNode *)0x2;
    break;
  case BadExpression:
    this_local = (SyntaxNode *)0x1;
    break;
  case BeginKeywordsDirective:
    this_local = (SyntaxNode *)0x2;
    break;
  case BinSelectWithFilterExpr:
    this_local = (SyntaxNode *)0x6;
    break;
  case BinaryAndExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case BinaryBinsSelectExpr:
    this_local = (SyntaxNode *)0x3;
    break;
  case BinaryBlockEventExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case BinaryEventExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case BinaryOrExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case BinaryXnorExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case BinaryXorExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case BindDirective:
    this_local = (SyntaxNode *)0x5;
    break;
  case BindTargetList:
    this_local = (SyntaxNode *)0x2;
    break;
  case BinsSelectConditionExpr:
    this_local = (SyntaxNode *)0x5;
    break;
  case BinsSelection:
    this_local = (SyntaxNode *)0x7;
    break;
  case BitSelect:
    this_local = (SyntaxNode *)0x1;
    break;
  case BitType:
    this_local = (SyntaxNode *)0x3;
    break;
  case BlockCoverageEvent:
    this_local = (SyntaxNode *)0x4;
    break;
  case BlockingEventTriggerStatement:
    this_local = (SyntaxNode *)0x6;
    break;
  case ByteType:
    this_local = (SyntaxNode *)0x3;
    break;
  case CHandleType:
    this_local = (SyntaxNode *)0x1;
    break;
  case CaseEqualityExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case CaseGenerate:
    this_local = (SyntaxNode *)0x7;
    break;
  case CaseInequalityExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case CasePropertyExpr:
    this_local = (SyntaxNode *)0x6;
    break;
  case CaseStatement:
    this_local = (SyntaxNode *)0xa;
    break;
  case CastExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case CellConfigRule:
    this_local = (SyntaxNode *)0x4;
    break;
  case CellDefineDirective:
    this_local = (SyntaxNode *)0x1;
    break;
  case ChargeStrength:
    this_local = (SyntaxNode *)0x3;
    break;
  case CheckerDataDeclaration:
    this_local = (SyntaxNode *)0x3;
    break;
  case CheckerDeclaration:
    this_local = (SyntaxNode *)0x8;
    break;
  case CheckerInstanceStatement:
    this_local = (SyntaxNode *)0x3;
    break;
  case CheckerInstantiation:
    this_local = (SyntaxNode *)0x5;
    break;
  case ClassDeclaration:
    this_local = (SyntaxNode *)0xc;
    break;
  case ClassMethodDeclaration:
    this_local = (SyntaxNode *)0x3;
    break;
  case ClassMethodPrototype:
    this_local = (SyntaxNode *)0x4;
    break;
  case ClassName:
    this_local = (SyntaxNode *)0x2;
    break;
  case ClassPropertyDeclaration:
    this_local = (SyntaxNode *)0x3;
    break;
  case ClockingDeclaration:
    this_local = (SyntaxNode *)0xa;
    break;
  case ClockingDirection:
    this_local = (SyntaxNode *)0x4;
    break;
  case ClockingItem:
    this_local = (SyntaxNode *)0x4;
    break;
  case ClockingPropertyExpr:
    this_local = (SyntaxNode *)0x2;
    break;
  case ClockingSequenceExpr:
    this_local = (SyntaxNode *)0x2;
    break;
  case ClockingSkew:
    this_local = (SyntaxNode *)0x2;
    break;
  case ColonExpressionClause:
    this_local = (SyntaxNode *)0x2;
    break;
  case CompilationUnit:
    this_local = (SyntaxNode *)0x2;
    break;
  case ConcatenationExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case ConcurrentAssertionMember:
    this_local = (SyntaxNode *)0x2;
    break;
  case ConditionalConstraint:
    this_local = (SyntaxNode *)0x6;
    break;
  case ConditionalExpression:
    this_local = (SyntaxNode *)0x6;
    break;
  case ConditionalPathDeclaration:
    this_local = (SyntaxNode *)0x6;
    break;
  case ConditionalPattern:
    this_local = (SyntaxNode *)0x2;
    break;
  case ConditionalPredicate:
    this_local = (SyntaxNode *)0x1;
    break;
  case ConditionalPropertyExpr:
    this_local = (SyntaxNode *)0x6;
    break;
  case ConditionalStatement:
    this_local = (SyntaxNode *)0x9;
    break;
  case ConfigCellIdentifier:
    this_local = (SyntaxNode *)0x3;
    break;
  case ConfigDeclaration:
    this_local = (SyntaxNode *)0xb;
    break;
  case ConfigInstanceIdentifier:
    this_local = (SyntaxNode *)0x2;
    break;
  case ConfigLiblist:
    this_local = (SyntaxNode *)0x2;
    break;
  case ConfigUseClause:
    this_local = (SyntaxNode *)0x5;
    break;
  case ConstraintBlock:
    this_local = (SyntaxNode *)0x3;
    break;
  case ConstraintDeclaration:
    this_local = (SyntaxNode *)0x5;
    break;
  case ConstraintPrototype:
    this_local = (SyntaxNode *)0x5;
    break;
  case ConstructorName:
    this_local = (SyntaxNode *)0x1;
    break;
  case ContinuousAssign:
    this_local = (SyntaxNode *)0x6;
    break;
  case CopyClassExpression:
    this_local = (SyntaxNode *)0x2;
    break;
  case CoverCross:
    this_local = (SyntaxNode *)0x9;
    break;
  case CoverPropertyStatement:
    this_local = (SyntaxNode *)0x8;
    break;
  case CoverSequenceStatement:
    this_local = (SyntaxNode *)0x8;
    break;
  case CoverageBins:
    this_local = (SyntaxNode *)0x9;
    break;
  case CoverageBinsArraySize:
    this_local = (SyntaxNode *)0x3;
    break;
  case CoverageIffClause:
    this_local = (SyntaxNode *)0x4;
    break;
  case CoverageOption:
    this_local = (SyntaxNode *)0x3;
    break;
  case CovergroupDeclaration:
    this_local = (SyntaxNode *)0x9;
    break;
  case Coverpoint:
    this_local = (SyntaxNode *)0xa;
    break;
  case CycleDelay:
    this_local = (SyntaxNode *)0x2;
    break;
  case DPIExport:
    this_local = (SyntaxNode *)0x8;
    break;
  case DPIImport:
    this_local = (SyntaxNode *)0x8;
    break;
  case DataDeclaration:
    this_local = (SyntaxNode *)0x5;
    break;
  case Declarator:
    this_local = (SyntaxNode *)0x3;
    break;
  case DefParam:
    this_local = (SyntaxNode *)0x4;
    break;
  case DefParamAssignment:
    this_local = (SyntaxNode *)0x2;
    break;
  case DefaultCaseItem:
    this_local = (SyntaxNode *)0x3;
    break;
  case DefaultClockingReference:
    this_local = (SyntaxNode *)0x5;
    break;
  case DefaultConfigRule:
    this_local = (SyntaxNode *)0x3;
    break;
  case DefaultCoverageBinInitializer:
    this_local = (SyntaxNode *)0x2;
    break;
  case DefaultDisableDeclaration:
    this_local = (SyntaxNode *)0x6;
    break;
  case DefaultNetTypeDirective:
    this_local = (SyntaxNode *)0x2;
    break;
  case DefaultPatternKeyExpression:
    this_local = (SyntaxNode *)0x1;
    break;
  case DefaultPropertyCaseItem:
    this_local = (SyntaxNode *)0x4;
    break;
  case DefaultRsCaseItem:
    this_local = (SyntaxNode *)0x4;
    break;
  case DefaultSkewItem:
    this_local = (SyntaxNode *)0x4;
    break;
  case DeferredAssertion:
    this_local = (SyntaxNode *)0x3;
    break;
  case DefineDirective:
    this_local = (SyntaxNode *)0x4;
    break;
  case Delay3:
    this_local = (SyntaxNode *)0x8;
    break;
  case DelayControl:
    this_local = (SyntaxNode *)0x2;
    break;
  case DelayedSequenceElement:
    this_local = (SyntaxNode *)0x7;
    break;
  case DelayedSequenceExpr:
    this_local = (SyntaxNode *)0x2;
    break;
  case DelayedTerminalArg:
    this_local = (SyntaxNode *)0x4;
    break;
  case DescendingRangeSelect:
    this_local = (SyntaxNode *)0x3;
    break;
  case DisableConstraint:
    this_local = (SyntaxNode *)0x4;
    break;
  case DisableForkStatement:
    this_local = (SyntaxNode *)0x5;
    break;
  case DisableIff:
    this_local = (SyntaxNode *)0x5;
    break;
  case DisableStatement:
    this_local = (SyntaxNode *)0x5;
    break;
  case DistConstraintList:
    this_local = (SyntaxNode *)0x4;
    break;
  case DistItem:
    this_local = (SyntaxNode *)0x2;
    break;
  case DistWeight:
    this_local = (SyntaxNode *)0x2;
    break;
  case DivideAssignmentExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case DivideExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case DividerClause:
    this_local = (SyntaxNode *)0x2;
    break;
  case DoWhileStatement:
    this_local = (SyntaxNode *)0x9;
    break;
  case DotMemberClause:
    this_local = (SyntaxNode *)0x2;
    break;
  case DriveStrength:
    this_local = (SyntaxNode *)0x5;
    break;
  case EdgeControlSpecifier:
    this_local = (SyntaxNode *)0x3;
    break;
  case EdgeDescriptor:
    this_local = (SyntaxNode *)0x2;
    break;
  case EdgeSensitivePathSuffix:
    this_local = (SyntaxNode *)0x6;
    break;
  case ElabSystemTask:
    this_local = (SyntaxNode *)0x4;
    break;
  case ElementSelect:
    this_local = (SyntaxNode *)0x3;
    break;
  case ElementSelectExpression:
    this_local = (SyntaxNode *)0x2;
    break;
  case ElsIfDirective:
    this_local = (SyntaxNode *)0x3;
    break;
  case ElseClause:
    this_local = (SyntaxNode *)0x2;
    break;
  case ElseConstraintClause:
    this_local = (SyntaxNode *)0x2;
    break;
  case ElseDirective:
    this_local = (SyntaxNode *)0x2;
    break;
  case ElsePropertyClause:
    this_local = (SyntaxNode *)0x2;
    break;
  case EmptyArgument:
    this_local = (SyntaxNode *)0x1;
    break;
  case EmptyIdentifierName:
    this_local = (SyntaxNode *)0x1;
    break;
  case EmptyMember:
    this_local = (SyntaxNode *)0x3;
    break;
  case EmptyNonAnsiPort:
    this_local = (SyntaxNode *)0x1;
    break;
  case EmptyPortConnection:
    this_local = (SyntaxNode *)0x2;
    break;
  case EmptyQueueExpression:
    this_local = (SyntaxNode *)0x2;
    break;
  case EmptyStatement:
    this_local = (SyntaxNode *)0x3;
    break;
  case EmptyTimingCheckArg:
    this_local = (SyntaxNode *)0x1;
    break;
  case EndCellDefineDirective:
    this_local = (SyntaxNode *)0x1;
    break;
  case EndIfDirective:
    this_local = (SyntaxNode *)0x2;
    break;
  case EndKeywordsDirective:
    this_local = (SyntaxNode *)0x1;
    break;
  case EnumType:
    this_local = (SyntaxNode *)0x6;
    break;
  case EqualityExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case EqualsAssertionArgClause:
    this_local = (SyntaxNode *)0x2;
    break;
  case EqualsTypeClause:
    this_local = (SyntaxNode *)0x2;
    break;
  case EqualsValueClause:
    this_local = (SyntaxNode *)0x2;
    break;
  case EventControl:
    this_local = (SyntaxNode *)0x2;
    break;
  case EventControlWithExpression:
    this_local = (SyntaxNode *)0x2;
    break;
  case EventType:
    this_local = (SyntaxNode *)0x1;
    break;
  case ExpectPropertyStatement:
    this_local = (SyntaxNode *)0x8;
    break;
  case ExplicitAnsiPort:
    this_local = (SyntaxNode *)0x7;
    break;
  case ExplicitNonAnsiPort:
    this_local = (SyntaxNode *)0x5;
    break;
  case ExpressionConstraint:
    this_local = (SyntaxNode *)0x3;
    break;
  case ExpressionCoverageBinInitializer:
    this_local = (SyntaxNode *)0x1;
    break;
  case ExpressionOrDist:
    this_local = (SyntaxNode *)0x2;
    break;
  case ExpressionPattern:
    this_local = (SyntaxNode *)0x1;
    break;
  case ExpressionStatement:
    this_local = (SyntaxNode *)0x4;
    break;
  case ExpressionTimingCheckArg:
    this_local = (SyntaxNode *)0x2;
    break;
  case ExtendsClause:
    this_local = (SyntaxNode *)0x3;
    break;
  case ExternInterfaceMethod:
    this_local = (SyntaxNode *)0x5;
    break;
  case ExternModuleDecl:
    this_local = (SyntaxNode *)0x4;
    break;
  case ExternUdpDecl:
    this_local = (SyntaxNode *)0x6;
    break;
  case FinalBlock:
    this_local = (SyntaxNode *)0x3;
    break;
  case FirstMatchSequenceExpr:
    this_local = (SyntaxNode *)0x5;
    break;
  case FollowedByPropertyExpr:
    this_local = (SyntaxNode *)0x3;
    break;
  case ForLoopStatement:
    this_local = (SyntaxNode *)0xb;
    break;
  case ForVariableDeclaration:
    this_local = (SyntaxNode *)0x3;
    break;
  case ForeachLoopList:
    this_local = (SyntaxNode *)0x6;
    break;
  case ForeachLoopStatement:
    this_local = (SyntaxNode *)0x5;
    break;
  case ForeverStatement:
    this_local = (SyntaxNode *)0x4;
    break;
  case ForwardInterfaceClassTypedefDeclaration:
    this_local = (SyntaxNode *)0x6;
    break;
  case ForwardTypedefDeclaration:
    this_local = (SyntaxNode *)0x5;
    break;
  case FunctionDeclaration:
    this_local = (SyntaxNode *)0x6;
    break;
  case FunctionPort:
    this_local = (SyntaxNode *)0x6;
    break;
  case FunctionPortList:
    this_local = (SyntaxNode *)0x3;
    break;
  case FunctionPrototype:
    this_local = (SyntaxNode *)0x5;
    break;
  case GenerateBlock:
    this_local = (SyntaxNode *)0x7;
    break;
  case GenerateRegion:
    this_local = (SyntaxNode *)0x4;
    break;
  case GenvarDeclaration:
    this_local = (SyntaxNode *)0x4;
    break;
  case GreaterThanEqualExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case GreaterThanExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case HierarchicalInstance:
    this_local = (SyntaxNode *)0x4;
    break;
  case HierarchyInstantiation:
    this_local = (SyntaxNode *)0x5;
    break;
  case IdWithExprCoverageBinInitializer:
    this_local = (SyntaxNode *)0x2;
    break;
  case IdentifierName:
    this_local = (SyntaxNode *)0x1;
    break;
  case IdentifierSelectName:
    this_local = (SyntaxNode *)0x2;
    break;
  case IfDefDirective:
    this_local = (SyntaxNode *)0x3;
    break;
  case IfGenerate:
    this_local = (SyntaxNode *)0x7;
    break;
  case IfNDefDirective:
    this_local = (SyntaxNode *)0x3;
    break;
  case IfNonePathDeclaration:
    this_local = (SyntaxNode *)0x3;
    break;
  case IffEventClause:
    this_local = (SyntaxNode *)0x2;
    break;
  case IffPropertyExpr:
    this_local = (SyntaxNode *)0x3;
    break;
  case ImmediateAssertStatement:
    this_local = (SyntaxNode *)0x6;
    break;
  case ImmediateAssertionMember:
    this_local = (SyntaxNode *)0x2;
    break;
  case ImmediateAssumeStatement:
    this_local = (SyntaxNode *)0x6;
    break;
  case ImmediateCoverStatement:
    this_local = (SyntaxNode *)0x6;
    break;
  case ImplementsClause:
    this_local = (SyntaxNode *)0x2;
    break;
  case ImplicationConstraint:
    this_local = (SyntaxNode *)0x3;
    break;
  case ImplicationPropertyExpr:
    this_local = (SyntaxNode *)0x3;
    break;
  case ImplicitAnsiPort:
    this_local = (SyntaxNode *)0x3;
    break;
  case ImplicitEventControl:
    this_local = (SyntaxNode *)0x4;
    break;
  case ImplicitNonAnsiPort:
    this_local = (SyntaxNode *)0x1;
    break;
  case ImplicitType:
    this_local = (SyntaxNode *)0x3;
    break;
  case ImpliesPropertyExpr:
    this_local = (SyntaxNode *)0x3;
    break;
  case IncludeDirective:
    this_local = (SyntaxNode *)0x2;
    break;
  case InequalityExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case InitialBlock:
    this_local = (SyntaxNode *)0x3;
    break;
  case InsideExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case InstanceConfigRule:
    this_local = (SyntaxNode *)0x5;
    break;
  case InstanceName:
    this_local = (SyntaxNode *)0x2;
    break;
  case IntType:
    this_local = (SyntaxNode *)0x3;
    break;
  case IntegerLiteralExpression:
    this_local = (SyntaxNode *)0x1;
    break;
  case IntegerType:
    this_local = (SyntaxNode *)0x3;
    break;
  case IntegerVectorExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case InterfaceDeclaration:
    this_local = (SyntaxNode *)0x5;
    break;
  case InterfaceHeader:
    this_local = (SyntaxNode *)0x7;
    break;
  case InterfacePortHeader:
    this_local = (SyntaxNode *)0x2;
    break;
  case IntersectClause:
    this_local = (SyntaxNode *)0x2;
    break;
  case IntersectSequenceExpr:
    this_local = (SyntaxNode *)0x3;
    break;
  case InvocationExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case JumpStatement:
    this_local = (SyntaxNode *)0x4;
    break;
  case LessThanEqualExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case LessThanExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case LetDeclaration:
    this_local = (SyntaxNode *)0x7;
    break;
  case LineDirective:
    this_local = (SyntaxNode *)0x4;
    break;
  case LocalScope:
    this_local = (SyntaxNode *)0x1;
    break;
  case LocalVariableDeclaration:
    this_local = (SyntaxNode *)0x5;
    break;
  case LogicType:
    this_local = (SyntaxNode *)0x3;
    break;
  case LogicalAndExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case LogicalEquivalenceExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case LogicalImplicationExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case LogicalLeftShiftAssignmentExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case LogicalOrExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case LogicalRightShiftAssignmentExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case LogicalShiftLeftExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case LogicalShiftRightExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case LongIntType:
    this_local = (SyntaxNode *)0x3;
    break;
  case LoopConstraint:
    this_local = (SyntaxNode *)0x3;
    break;
  case LoopGenerate:
    this_local = (SyntaxNode *)0xd;
    break;
  case LoopStatement:
    this_local = (SyntaxNode *)0x7;
    break;
  case MacroActualArgument:
    this_local = (SyntaxNode *)0x1;
    break;
  case MacroActualArgumentList:
    this_local = (SyntaxNode *)0x3;
    break;
  case MacroArgumentDefault:
    this_local = (SyntaxNode *)0x2;
    break;
  case MacroFormalArgument:
    this_local = (SyntaxNode *)0x2;
    break;
  case MacroFormalArgumentList:
    this_local = (SyntaxNode *)0x3;
    break;
  case MacroUsage:
    this_local = (SyntaxNode *)0x2;
    break;
  case MatchesClause:
    this_local = (SyntaxNode *)0x2;
    break;
  case MemberAccessExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case MinTypMaxExpression:
    this_local = (SyntaxNode *)0x5;
    break;
  case ModAssignmentExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case ModExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case ModportClockingPort:
    this_local = (SyntaxNode *)0x3;
    break;
  case ModportDeclaration:
    this_local = (SyntaxNode *)0x4;
    break;
  case ModportExplicitPort:
    this_local = (SyntaxNode *)0x5;
    break;
  case ModportItem:
    this_local = (SyntaxNode *)0x2;
    break;
  case ModportNamedPort:
    this_local = (SyntaxNode *)0x1;
    break;
  case ModportSimplePortList:
    this_local = (SyntaxNode *)0x3;
    break;
  case ModportSubroutinePort:
    this_local = (SyntaxNode *)0x1;
    break;
  case ModportSubroutinePortList:
    this_local = (SyntaxNode *)0x3;
    break;
  case ModuleDeclaration:
    this_local = (SyntaxNode *)0x5;
    break;
  case ModuleHeader:
    this_local = (SyntaxNode *)0x7;
    break;
  case MultipleConcatenationExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case MultiplyAssignmentExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case MultiplyExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case NameValuePragmaExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case NamedArgument:
    this_local = (SyntaxNode *)0x5;
    break;
  case NamedBlockClause:
    this_local = (SyntaxNode *)0x2;
    break;
  case NamedLabel:
    this_local = (SyntaxNode *)0x2;
    break;
  case NamedParamAssignment:
    this_local = (SyntaxNode *)0x5;
    break;
  case NamedPortConnection:
    this_local = (SyntaxNode *)0x6;
    break;
  case NamedStructurePatternMember:
    this_local = (SyntaxNode *)0x3;
    break;
  case NamedType:
    this_local = (SyntaxNode *)0x1;
    break;
  case NetAlias:
    this_local = (SyntaxNode *)0x4;
    break;
  case NetDeclaration:
    this_local = (SyntaxNode *)0x8;
    break;
  case NetPortHeader:
    this_local = (SyntaxNode *)0x3;
    break;
  case NetTypeDeclaration:
    this_local = (SyntaxNode *)0x6;
    break;
  case NewArrayExpression:
    this_local = (SyntaxNode *)0x5;
    break;
  case NewClassExpression:
    this_local = (SyntaxNode *)0x2;
    break;
  case NoUnconnectedDriveDirective:
    this_local = (SyntaxNode *)0x1;
    break;
  case NonAnsiPortList:
    this_local = (SyntaxNode *)0x3;
    break;
  case NonAnsiUdpPortList:
    this_local = (SyntaxNode *)0x4;
    break;
  case NonblockingAssignmentExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case NonblockingEventTriggerStatement:
    this_local = (SyntaxNode *)0x6;
    break;
  case NullLiteralExpression:
    this_local = (SyntaxNode *)0x1;
    break;
  case NumberPragmaExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case OneStepDelay:
    this_local = (SyntaxNode *)0x2;
    break;
  case OpenRangeExpression:
    this_local = (SyntaxNode *)0x5;
    break;
  case OpenRangeList:
    this_local = (SyntaxNode *)0x3;
    break;
  case OrAssignmentExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case OrPropertyExpr:
    this_local = (SyntaxNode *)0x3;
    break;
  case OrSequenceExpr:
    this_local = (SyntaxNode *)0x3;
    break;
  case OrderedArgument:
    this_local = (SyntaxNode *)0x1;
    break;
  case OrderedParamAssignment:
    this_local = (SyntaxNode *)0x1;
    break;
  case OrderedPortConnection:
    this_local = (SyntaxNode *)0x2;
    break;
  case OrderedStructurePatternMember:
    this_local = (SyntaxNode *)0x1;
    break;
  case PackageDeclaration:
    this_local = (SyntaxNode *)0x5;
    break;
  case PackageExportAllDeclaration:
    this_local = (SyntaxNode *)0x6;
    break;
  case PackageExportDeclaration:
    this_local = (SyntaxNode *)0x4;
    break;
  case PackageHeader:
    this_local = (SyntaxNode *)0x7;
    break;
  case PackageImportDeclaration:
    this_local = (SyntaxNode *)0x4;
    break;
  case PackageImportItem:
    this_local = (SyntaxNode *)0x3;
    break;
  case ParallelBlockStatement:
    this_local = (SyntaxNode *)0x7;
    break;
  case ParameterDeclaration:
    this_local = (SyntaxNode *)0x3;
    break;
  case ParameterDeclarationStatement:
    this_local = (SyntaxNode *)0x3;
    break;
  case ParameterPortList:
    this_local = (SyntaxNode *)0x4;
    break;
  case ParameterValueAssignment:
    this_local = (SyntaxNode *)0x4;
    break;
  case ParenExpressionList:
    this_local = (SyntaxNode *)0x3;
    break;
  case ParenPragmaExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case ParenthesizedBinsSelectExpr:
    this_local = (SyntaxNode *)0x3;
    break;
  case ParenthesizedEventExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case ParenthesizedExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case ParenthesizedPattern:
    this_local = (SyntaxNode *)0x3;
    break;
  case ParenthesizedPropertyExpr:
    this_local = (SyntaxNode *)0x4;
    break;
  case ParenthesizedSequenceExpr:
    this_local = (SyntaxNode *)0x5;
    break;
  case PathDeclaration:
    this_local = (SyntaxNode *)0x7;
    break;
  case PathDescription:
    this_local = (SyntaxNode *)0x7;
    break;
  case PatternCaseItem:
    this_local = (SyntaxNode *)0x5;
    break;
  case PortConcatenation:
    this_local = (SyntaxNode *)0x3;
    break;
  case PortDeclaration:
    this_local = (SyntaxNode *)0x4;
    break;
  case PortReference:
    this_local = (SyntaxNode *)0x2;
    break;
  case PostdecrementExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case PostincrementExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case PowerExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case PragmaDirective:
    this_local = (SyntaxNode *)0x3;
    break;
  case PrimaryBlockEventExpression:
    this_local = (SyntaxNode *)0x2;
    break;
  case PrimitiveInstantiation:
    this_local = (SyntaxNode *)0x6;
    break;
  case ProceduralAssignStatement:
    this_local = (SyntaxNode *)0x5;
    break;
  case ProceduralDeassignStatement:
    this_local = (SyntaxNode *)0x5;
    break;
  case ProceduralForceStatement:
    this_local = (SyntaxNode *)0x5;
    break;
  case ProceduralReleaseStatement:
    this_local = (SyntaxNode *)0x5;
    break;
  case Production:
    this_local = (SyntaxNode *)0x6;
    break;
  case ProgramDeclaration:
    this_local = (SyntaxNode *)0x5;
    break;
  case ProgramHeader:
    this_local = (SyntaxNode *)0x7;
    break;
  case PropertyDeclaration:
    this_local = (SyntaxNode *)0xa;
    break;
  case PropertySpec:
    this_local = (SyntaxNode *)0x3;
    break;
  case PropertyType:
    this_local = (SyntaxNode *)0x1;
    break;
  case PullStrength:
    this_local = (SyntaxNode *)0x3;
    break;
  case PulseStyleDeclaration:
    this_local = (SyntaxNode *)0x4;
    break;
  case QueueDimensionSpecifier:
    this_local = (SyntaxNode *)0x2;
    break;
  case RandCaseItem:
    this_local = (SyntaxNode *)0x3;
    break;
  case RandCaseStatement:
    this_local = (SyntaxNode *)0x5;
    break;
  case RandJoinClause:
    this_local = (SyntaxNode *)0x3;
    break;
  case RandSequenceStatement:
    this_local = (SyntaxNode *)0x8;
    break;
  case RangeCoverageBinInitializer:
    this_local = (SyntaxNode *)0x2;
    break;
  case RangeDimensionSpecifier:
    this_local = (SyntaxNode *)0x1;
    break;
  case RealLiteralExpression:
    this_local = (SyntaxNode *)0x1;
    break;
  case RealTimeType:
    this_local = (SyntaxNode *)0x1;
    break;
  case RealType:
    this_local = (SyntaxNode *)0x1;
    break;
  case RegType:
    this_local = (SyntaxNode *)0x3;
    break;
  case RepeatedEventControl:
    this_local = (SyntaxNode *)0x5;
    break;
  case ReplicatedAssignmentPattern:
    this_local = (SyntaxNode *)0x6;
    break;
  case ResetAllDirective:
    this_local = (SyntaxNode *)0x1;
    break;
  case RestrictPropertyStatement:
    this_local = (SyntaxNode *)0x8;
    break;
  case ReturnStatement:
    this_local = (SyntaxNode *)0x5;
    break;
  case RootScope:
    this_local = (SyntaxNode *)0x1;
    break;
  case RsCase:
    this_local = (SyntaxNode *)0x6;
    break;
  case RsCodeBlock:
    this_local = (SyntaxNode *)0x3;
    break;
  case RsElseClause:
    this_local = (SyntaxNode *)0x2;
    break;
  case RsIfElse:
    this_local = (SyntaxNode *)0x6;
    break;
  case RsProdItem:
    this_local = (SyntaxNode *)0x2;
    break;
  case RsRepeat:
    this_local = (SyntaxNode *)0x5;
    break;
  case RsRule:
    this_local = (SyntaxNode *)0x3;
    break;
  case RsWeightClause:
    this_local = (SyntaxNode *)0x3;
    break;
  case SUntilPropertyExpr:
    this_local = (SyntaxNode *)0x3;
    break;
  case SUntilWithPropertyExpr:
    this_local = (SyntaxNode *)0x3;
    break;
  case ScopedName:
    this_local = (SyntaxNode *)0x3;
    break;
  case SequenceDeclaration:
    this_local = (SyntaxNode *)0xa;
    break;
  case SequenceMatchList:
    this_local = (SyntaxNode *)0x2;
    break;
  case SequenceRepetition:
    this_local = (SyntaxNode *)0x4;
    break;
  case SequenceType:
    this_local = (SyntaxNode *)0x1;
    break;
  case SequentialBlockStatement:
    this_local = (SyntaxNode *)0x7;
    break;
  case ShortIntType:
    this_local = (SyntaxNode *)0x3;
    break;
  case ShortRealType:
    this_local = (SyntaxNode *)0x1;
    break;
  case SignalEventExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case SignedCastExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case SimpleAssignmentPattern:
    this_local = (SyntaxNode *)0x3;
    break;
  case SimpleBinsSelectExpr:
    this_local = (SyntaxNode *)0x2;
    break;
  case SimplePathSuffix:
    this_local = (SyntaxNode *)0x1;
    break;
  case SimplePragmaExpression:
    this_local = (SyntaxNode *)0x1;
    break;
  case SimplePropertyExpr:
    this_local = (SyntaxNode *)0x1;
    break;
  case SimpleRangeSelect:
    this_local = (SyntaxNode *)0x3;
    break;
  case SimpleSequenceExpr:
    this_local = (SyntaxNode *)0x2;
    break;
  case SolveBeforeConstraint:
    this_local = (SyntaxNode *)0x5;
    break;
  case SpecifyBlock:
    this_local = (SyntaxNode *)0x4;
    break;
  case SpecparamDeclaration:
    this_local = (SyntaxNode *)0x5;
    break;
  case SpecparamDeclarator:
    this_local = (SyntaxNode *)0x3;
    break;
  case StandardCaseItem:
    this_local = (SyntaxNode *)0x3;
    break;
  case StandardPropertyCaseItem:
    this_local = (SyntaxNode *)0x4;
    break;
  case StandardRsCaseItem:
    this_local = (SyntaxNode *)0x4;
    break;
  case StreamExpression:
    this_local = (SyntaxNode *)0x2;
    break;
  case StreamExpressionWithRange:
    this_local = (SyntaxNode *)0x2;
    break;
  case StreamingConcatenationExpression:
    this_local = (SyntaxNode *)0x7;
    break;
  case StringLiteralExpression:
    this_local = (SyntaxNode *)0x1;
    break;
  case StringType:
    this_local = (SyntaxNode *)0x1;
    break;
  case StrongWeakPropertyExpr:
    this_local = (SyntaxNode *)0x4;
    break;
  case StructType:
    this_local = (SyntaxNode *)0x8;
    break;
  case StructUnionMember:
    this_local = (SyntaxNode *)0x5;
    break;
  case StructurePattern:
    this_local = (SyntaxNode *)0x3;
    break;
  case StructuredAssignmentPattern:
    this_local = (SyntaxNode *)0x3;
    break;
  case SubtractAssignmentExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case SubtractExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case SuperHandle:
    this_local = (SyntaxNode *)0x1;
    break;
  case SystemName:
    this_local = (SyntaxNode *)0x1;
    break;
  case SystemTimingCheck:
    this_local = (SyntaxNode *)0x6;
    break;
  case TaggedPattern:
    this_local = (SyntaxNode *)0x3;
    break;
  case TaggedUnionExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case TaskDeclaration:
    this_local = (SyntaxNode *)0x6;
    break;
  case ThisHandle:
    this_local = (SyntaxNode *)0x1;
    break;
  case ThroughoutSequenceExpr:
    this_local = (SyntaxNode *)0x3;
    break;
  case TimeLiteralExpression:
    this_local = (SyntaxNode *)0x1;
    break;
  case TimeScaleDirective:
    this_local = (SyntaxNode *)0x4;
    break;
  case TimeType:
    this_local = (SyntaxNode *)0x3;
    break;
  case TimeUnitsDeclaration:
    this_local = (SyntaxNode *)0x5;
    break;
  case TimingCheckCondition:
    this_local = (SyntaxNode *)0x2;
    break;
  case TimingCheckEvent:
    this_local = (SyntaxNode *)0x4;
    break;
  case TimingControlExpression:
    this_local = (SyntaxNode *)0x2;
    break;
  case TimingControlStatement:
    this_local = (SyntaxNode *)0x4;
    break;
  case TransListCoverageBinInitializer:
    this_local = (SyntaxNode *)0x1;
    break;
  case TransRange:
    this_local = (SyntaxNode *)0x2;
    break;
  case TransRepeatRange:
    this_local = (SyntaxNode *)0x4;
    break;
  case TransSet:
    this_local = (SyntaxNode *)0x3;
    break;
  case TypeAssignment:
    this_local = (SyntaxNode *)0x2;
    break;
  case TypeParameterDeclaration:
    this_local = (SyntaxNode *)0x3;
    break;
  case TypeReference:
    this_local = (SyntaxNode *)0x4;
    break;
  case TypedefDeclaration:
    this_local = (SyntaxNode *)0x6;
    break;
  case UdpBody:
    this_local = (SyntaxNode *)0x5;
    break;
  case UdpDeclaration:
    this_local = (SyntaxNode *)0x7;
    break;
  case UdpEdgeIndicator:
    this_local = (SyntaxNode *)0x4;
    break;
  case UdpEntry:
    this_local = (SyntaxNode *)0x8;
    break;
  case UdpInitialStmt:
    this_local = (SyntaxNode *)0x5;
    break;
  case UdpInputPortDecl:
    this_local = (SyntaxNode *)0x3;
    break;
  case UdpOutputPortDecl:
    this_local = (SyntaxNode *)0x5;
    break;
  case UnaryBinsSelectExpr:
    this_local = (SyntaxNode *)0x2;
    break;
  case UnaryBitwiseAndExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case UnaryBitwiseNandExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case UnaryBitwiseNorExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case UnaryBitwiseNotExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case UnaryBitwiseOrExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case UnaryBitwiseXnorExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case UnaryBitwiseXorExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case UnaryLogicalNotExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case UnaryMinusExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case UnaryPlusExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case UnaryPredecrementExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case UnaryPreincrementExpression:
    this_local = (SyntaxNode *)0x3;
    break;
  case UnaryPropertyExpr:
    this_local = (SyntaxNode *)0x2;
    break;
  case UnarySelectPropertyExpr:
    this_local = (SyntaxNode *)0x5;
    break;
  case UnbasedUnsizedLiteralExpression:
    this_local = (SyntaxNode *)0x1;
    break;
  case UnconnectedDriveDirective:
    this_local = (SyntaxNode *)0x2;
    break;
  case UndefDirective:
    this_local = (SyntaxNode *)0x2;
    break;
  case UndefineAllDirective:
    this_local = (SyntaxNode *)0x1;
    break;
  case UnionType:
    this_local = (SyntaxNode *)0x8;
    break;
  case UniquenessConstraint:
    this_local = (SyntaxNode *)0x3;
    break;
  case UnitScope:
    this_local = (SyntaxNode *)0x1;
    break;
  case UntilPropertyExpr:
    this_local = (SyntaxNode *)0x3;
    break;
  case UntilWithPropertyExpr:
    this_local = (SyntaxNode *)0x3;
    break;
  case Untyped:
    this_local = (SyntaxNode *)0x1;
    break;
  case UserDefinedNetDeclaration:
    this_local = (SyntaxNode *)0x5;
    break;
  case VariableDimension:
    this_local = (SyntaxNode *)0x3;
    break;
  case VariablePattern:
    this_local = (SyntaxNode *)0x2;
    break;
  case VariablePortHeader:
    this_local = (SyntaxNode *)0x4;
    break;
  case VirtualInterfaceType:
    this_local = (SyntaxNode *)0x5;
    break;
  case VoidCastedCallStatement:
    this_local = (SyntaxNode *)0x8;
    break;
  case VoidType:
    this_local = (SyntaxNode *)0x1;
    break;
  case WaitForkStatement:
    this_local = (SyntaxNode *)0x5;
    break;
  case WaitOrderStatement:
    this_local = (SyntaxNode *)0x7;
    break;
  case WaitStatement:
    this_local = (SyntaxNode *)0x7;
    break;
  case WildcardDimensionSpecifier:
    this_local = (SyntaxNode *)0x1;
    break;
  case WildcardEqualityExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case WildcardInequalityExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  case WildcardLiteralExpression:
    this_local = (SyntaxNode *)0x1;
    break;
  case WildcardPattern:
    this_local = (SyntaxNode *)0x1;
    break;
  case WildcardPortConnection:
    this_local = (SyntaxNode *)0x2;
    break;
  case WildcardPortList:
    this_local = (SyntaxNode *)0x3;
    break;
  case WildcardUdpPortList:
    this_local = (SyntaxNode *)0x4;
    break;
  case WithClause:
    this_local = (SyntaxNode *)0x4;
    break;
  case WithFunctionClause:
    this_local = (SyntaxNode *)0x2;
    break;
  case WithFunctionSample:
    this_local = (SyntaxNode *)0x4;
    break;
  case WithinSequenceExpr:
    this_local = (SyntaxNode *)0x3;
    break;
  case XorAssignmentExpression:
    this_local = (SyntaxNode *)0x4;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_b9);
    std::operator+(&local_98,&local_b8,":");
    std::__cxx11::to_string(&local_f0,0x213);
    std::operator+(&local_78,&local_98,&local_f0);
    std::operator+(&local_58,&local_78,": ");
    std::operator+(&local_38,&local_58,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return (size_t)this_local;
}

Assistant:

size_t SyntaxNode::getChildCount() const {
    switch (kind) {
        case SyntaxKind::Unknown: return 0;
        case SyntaxKind::SyntaxList:
        case SyntaxKind::TokenList:
        case SyntaxKind::SeparatedList:
            return ((const SyntaxListBase*)this)->getChildCount();
        case SyntaxKind::AcceptOnPropertyExpr: return 5;
        case SyntaxKind::ActionBlock: return 2;
        case SyntaxKind::AddAssignmentExpression: return 4;
        case SyntaxKind::AddExpression: return 4;
        case SyntaxKind::AlwaysBlock: return 3;
        case SyntaxKind::AlwaysCombBlock: return 3;
        case SyntaxKind::AlwaysFFBlock: return 3;
        case SyntaxKind::AlwaysLatchBlock: return 3;
        case SyntaxKind::AndAssignmentExpression: return 4;
        case SyntaxKind::AndPropertyExpr: return 3;
        case SyntaxKind::AndSequenceExpr: return 3;
        case SyntaxKind::AnsiPortList: return 3;
        case SyntaxKind::AnsiUdpPortList: return 4;
        case SyntaxKind::ArgumentList: return 3;
        case SyntaxKind::ArithmeticLeftShiftAssignmentExpression: return 4;
        case SyntaxKind::ArithmeticRightShiftAssignmentExpression: return 4;
        case SyntaxKind::ArithmeticShiftLeftExpression: return 4;
        case SyntaxKind::ArithmeticShiftRightExpression: return 4;
        case SyntaxKind::ArrayAndMethod: return 1;
        case SyntaxKind::ArrayOrMethod: return 1;
        case SyntaxKind::ArrayOrRandomizeMethodExpression: return 4;
        case SyntaxKind::ArrayUniqueMethod: return 1;
        case SyntaxKind::ArrayXorMethod: return 1;
        case SyntaxKind::AscendingRangeSelect: return 3;
        case SyntaxKind::AssertPropertyStatement: return 8;
        case SyntaxKind::AssertionItemPort: return 7;
        case SyntaxKind::AssertionItemPortList: return 3;
        case SyntaxKind::AssignmentExpression: return 4;
        case SyntaxKind::AssignmentPatternExpression: return 2;
        case SyntaxKind::AssignmentPatternItem: return 3;
        case SyntaxKind::AssumePropertyStatement: return 8;
        case SyntaxKind::AttributeInstance: return 3;
        case SyntaxKind::AttributeSpec: return 2;
        case SyntaxKind::BadExpression: return 1;
        case SyntaxKind::BeginKeywordsDirective: return 2;
        case SyntaxKind::BinSelectWithFilterExpr: return 6;
        case SyntaxKind::BinaryAndExpression: return 4;
        case SyntaxKind::BinaryBinsSelectExpr: return 3;
        case SyntaxKind::BinaryBlockEventExpression: return 3;
        case SyntaxKind::BinaryEventExpression: return 3;
        case SyntaxKind::BinaryOrExpression: return 4;
        case SyntaxKind::BinaryXnorExpression: return 4;
        case SyntaxKind::BinaryXorExpression: return 4;
        case SyntaxKind::BindDirective: return 5;
        case SyntaxKind::BindTargetList: return 2;
        case SyntaxKind::BinsSelectConditionExpr: return 5;
        case SyntaxKind::BinsSelection: return 7;
        case SyntaxKind::BitSelect: return 1;
        case SyntaxKind::BitType: return 3;
        case SyntaxKind::BlockCoverageEvent: return 4;
        case SyntaxKind::BlockingEventTriggerStatement: return 6;
        case SyntaxKind::ByteType: return 3;
        case SyntaxKind::CHandleType: return 1;
        case SyntaxKind::CaseEqualityExpression: return 4;
        case SyntaxKind::CaseGenerate: return 7;
        case SyntaxKind::CaseInequalityExpression: return 4;
        case SyntaxKind::CasePropertyExpr: return 6;
        case SyntaxKind::CaseStatement: return 10;
        case SyntaxKind::CastExpression: return 3;
        case SyntaxKind::CellConfigRule: return 4;
        case SyntaxKind::CellDefineDirective: return 1;
        case SyntaxKind::ChargeStrength: return 3;
        case SyntaxKind::CheckerDataDeclaration: return 3;
        case SyntaxKind::CheckerDeclaration: return 8;
        case SyntaxKind::CheckerInstanceStatement: return 3;
        case SyntaxKind::CheckerInstantiation: return 5;
        case SyntaxKind::ClassDeclaration: return 12;
        case SyntaxKind::ClassMethodDeclaration: return 3;
        case SyntaxKind::ClassMethodPrototype: return 4;
        case SyntaxKind::ClassName: return 2;
        case SyntaxKind::ClassPropertyDeclaration: return 3;
        case SyntaxKind::ClockingDeclaration: return 10;
        case SyntaxKind::ClockingDirection: return 4;
        case SyntaxKind::ClockingItem: return 4;
        case SyntaxKind::ClockingPropertyExpr: return 2;
        case SyntaxKind::ClockingSequenceExpr: return 2;
        case SyntaxKind::ClockingSkew: return 2;
        case SyntaxKind::ColonExpressionClause: return 2;
        case SyntaxKind::CompilationUnit: return 2;
        case SyntaxKind::ConcatenationExpression: return 3;
        case SyntaxKind::ConcurrentAssertionMember: return 2;
        case SyntaxKind::ConditionalConstraint: return 6;
        case SyntaxKind::ConditionalExpression: return 6;
        case SyntaxKind::ConditionalPathDeclaration: return 6;
        case SyntaxKind::ConditionalPattern: return 2;
        case SyntaxKind::ConditionalPredicate: return 1;
        case SyntaxKind::ConditionalPropertyExpr: return 6;
        case SyntaxKind::ConditionalStatement: return 9;
        case SyntaxKind::ConfigCellIdentifier: return 3;
        case SyntaxKind::ConfigDeclaration: return 11;
        case SyntaxKind::ConfigInstanceIdentifier: return 2;
        case SyntaxKind::ConfigLiblist: return 2;
        case SyntaxKind::ConfigUseClause: return 5;
        case SyntaxKind::ConstraintBlock: return 3;
        case SyntaxKind::ConstraintDeclaration: return 5;
        case SyntaxKind::ConstraintPrototype: return 5;
        case SyntaxKind::ConstructorName: return 1;
        case SyntaxKind::ContinuousAssign: return 6;
        case SyntaxKind::CopyClassExpression: return 2;
        case SyntaxKind::CoverCross: return 9;
        case SyntaxKind::CoverPropertyStatement: return 8;
        case SyntaxKind::CoverSequenceStatement: return 8;
        case SyntaxKind::CoverageBins: return 9;
        case SyntaxKind::CoverageBinsArraySize: return 3;
        case SyntaxKind::CoverageIffClause: return 4;
        case SyntaxKind::CoverageOption: return 3;
        case SyntaxKind::CovergroupDeclaration: return 9;
        case SyntaxKind::Coverpoint: return 10;
        case SyntaxKind::CycleDelay: return 2;
        case SyntaxKind::DPIExport: return 8;
        case SyntaxKind::DPIImport: return 8;
        case SyntaxKind::DataDeclaration: return 5;
        case SyntaxKind::Declarator: return 3;
        case SyntaxKind::DefParam: return 4;
        case SyntaxKind::DefParamAssignment: return 2;
        case SyntaxKind::DefaultCaseItem: return 3;
        case SyntaxKind::DefaultClockingReference: return 5;
        case SyntaxKind::DefaultConfigRule: return 3;
        case SyntaxKind::DefaultCoverageBinInitializer: return 2;
        case SyntaxKind::DefaultDisableDeclaration: return 6;
        case SyntaxKind::DefaultNetTypeDirective: return 2;
        case SyntaxKind::DefaultPatternKeyExpression: return 1;
        case SyntaxKind::DefaultPropertyCaseItem: return 4;
        case SyntaxKind::DefaultRsCaseItem: return 4;
        case SyntaxKind::DefaultSkewItem: return 4;
        case SyntaxKind::DeferredAssertion: return 3;
        case SyntaxKind::DefineDirective: return 4;
        case SyntaxKind::Delay3: return 8;
        case SyntaxKind::DelayControl: return 2;
        case SyntaxKind::DelayedSequenceElement: return 7;
        case SyntaxKind::DelayedSequenceExpr: return 2;
        case SyntaxKind::DelayedTerminalArg: return 4;
        case SyntaxKind::DescendingRangeSelect: return 3;
        case SyntaxKind::DisableConstraint: return 4;
        case SyntaxKind::DisableForkStatement: return 5;
        case SyntaxKind::DisableIff: return 5;
        case SyntaxKind::DisableStatement: return 5;
        case SyntaxKind::DistConstraintList: return 4;
        case SyntaxKind::DistItem: return 2;
        case SyntaxKind::DistWeight: return 2;
        case SyntaxKind::DivideAssignmentExpression: return 4;
        case SyntaxKind::DivideExpression: return 4;
        case SyntaxKind::DividerClause: return 2;
        case SyntaxKind::DoWhileStatement: return 9;
        case SyntaxKind::DotMemberClause: return 2;
        case SyntaxKind::DriveStrength: return 5;
        case SyntaxKind::EdgeControlSpecifier: return 3;
        case SyntaxKind::EdgeDescriptor: return 2;
        case SyntaxKind::EdgeSensitivePathSuffix: return 6;
        case SyntaxKind::ElabSystemTask: return 4;
        case SyntaxKind::ElementSelect: return 3;
        case SyntaxKind::ElementSelectExpression: return 2;
        case SyntaxKind::ElsIfDirective: return 3;
        case SyntaxKind::ElseClause: return 2;
        case SyntaxKind::ElseConstraintClause: return 2;
        case SyntaxKind::ElseDirective: return 2;
        case SyntaxKind::ElsePropertyClause: return 2;
        case SyntaxKind::EmptyArgument: return 1;
        case SyntaxKind::EmptyIdentifierName: return 1;
        case SyntaxKind::EmptyMember: return 3;
        case SyntaxKind::EmptyNonAnsiPort: return 1;
        case SyntaxKind::EmptyPortConnection: return 2;
        case SyntaxKind::EmptyQueueExpression: return 2;
        case SyntaxKind::EmptyStatement: return 3;
        case SyntaxKind::EmptyTimingCheckArg: return 1;
        case SyntaxKind::EndCellDefineDirective: return 1;
        case SyntaxKind::EndIfDirective: return 2;
        case SyntaxKind::EndKeywordsDirective: return 1;
        case SyntaxKind::EnumType: return 6;
        case SyntaxKind::EqualityExpression: return 4;
        case SyntaxKind::EqualsAssertionArgClause: return 2;
        case SyntaxKind::EqualsTypeClause: return 2;
        case SyntaxKind::EqualsValueClause: return 2;
        case SyntaxKind::EventControl: return 2;
        case SyntaxKind::EventControlWithExpression: return 2;
        case SyntaxKind::EventType: return 1;
        case SyntaxKind::ExpectPropertyStatement: return 8;
        case SyntaxKind::ExplicitAnsiPort: return 7;
        case SyntaxKind::ExplicitNonAnsiPort: return 5;
        case SyntaxKind::ExpressionConstraint: return 3;
        case SyntaxKind::ExpressionCoverageBinInitializer: return 1;
        case SyntaxKind::ExpressionOrDist: return 2;
        case SyntaxKind::ExpressionPattern: return 1;
        case SyntaxKind::ExpressionStatement: return 4;
        case SyntaxKind::ExpressionTimingCheckArg: return 2;
        case SyntaxKind::ExtendsClause: return 3;
        case SyntaxKind::ExternInterfaceMethod: return 5;
        case SyntaxKind::ExternModuleDecl: return 4;
        case SyntaxKind::ExternUdpDecl: return 6;
        case SyntaxKind::FinalBlock: return 3;
        case SyntaxKind::FirstMatchSequenceExpr: return 5;
        case SyntaxKind::FollowedByPropertyExpr: return 3;
        case SyntaxKind::ForLoopStatement: return 11;
        case SyntaxKind::ForVariableDeclaration: return 3;
        case SyntaxKind::ForeachLoopList: return 6;
        case SyntaxKind::ForeachLoopStatement: return 5;
        case SyntaxKind::ForeverStatement: return 4;
        case SyntaxKind::ForwardInterfaceClassTypedefDeclaration: return 6;
        case SyntaxKind::ForwardTypedefDeclaration: return 5;
        case SyntaxKind::FunctionDeclaration: return 6;
        case SyntaxKind::FunctionPort: return 6;
        case SyntaxKind::FunctionPortList: return 3;
        case SyntaxKind::FunctionPrototype: return 5;
        case SyntaxKind::GenerateBlock: return 7;
        case SyntaxKind::GenerateRegion: return 4;
        case SyntaxKind::GenvarDeclaration: return 4;
        case SyntaxKind::GreaterThanEqualExpression: return 4;
        case SyntaxKind::GreaterThanExpression: return 4;
        case SyntaxKind::HierarchicalInstance: return 4;
        case SyntaxKind::HierarchyInstantiation: return 5;
        case SyntaxKind::IdWithExprCoverageBinInitializer: return 2;
        case SyntaxKind::IdentifierName: return 1;
        case SyntaxKind::IdentifierSelectName: return 2;
        case SyntaxKind::IfDefDirective: return 3;
        case SyntaxKind::IfGenerate: return 7;
        case SyntaxKind::IfNDefDirective: return 3;
        case SyntaxKind::IfNonePathDeclaration: return 3;
        case SyntaxKind::IffEventClause: return 2;
        case SyntaxKind::IffPropertyExpr: return 3;
        case SyntaxKind::ImmediateAssertStatement: return 6;
        case SyntaxKind::ImmediateAssertionMember: return 2;
        case SyntaxKind::ImmediateAssumeStatement: return 6;
        case SyntaxKind::ImmediateCoverStatement: return 6;
        case SyntaxKind::ImplementsClause: return 2;
        case SyntaxKind::ImplicationConstraint: return 3;
        case SyntaxKind::ImplicationPropertyExpr: return 3;
        case SyntaxKind::ImplicitAnsiPort: return 3;
        case SyntaxKind::ImplicitEventControl: return 4;
        case SyntaxKind::ImplicitNonAnsiPort: return 1;
        case SyntaxKind::ImplicitType: return 3;
        case SyntaxKind::ImpliesPropertyExpr: return 3;
        case SyntaxKind::IncludeDirective: return 2;
        case SyntaxKind::InequalityExpression: return 4;
        case SyntaxKind::InitialBlock: return 3;
        case SyntaxKind::InsideExpression: return 3;
        case SyntaxKind::InstanceConfigRule: return 5;
        case SyntaxKind::InstanceName: return 2;
        case SyntaxKind::IntType: return 3;
        case SyntaxKind::IntegerLiteralExpression: return 1;
        case SyntaxKind::IntegerType: return 3;
        case SyntaxKind::IntegerVectorExpression: return 3;
        case SyntaxKind::InterfaceDeclaration: return 5;
        case SyntaxKind::InterfaceHeader: return 7;
        case SyntaxKind::InterfacePortHeader: return 2;
        case SyntaxKind::IntersectClause: return 2;
        case SyntaxKind::IntersectSequenceExpr: return 3;
        case SyntaxKind::InvocationExpression: return 3;
        case SyntaxKind::JumpStatement: return 4;
        case SyntaxKind::LessThanEqualExpression: return 4;
        case SyntaxKind::LessThanExpression: return 4;
        case SyntaxKind::LetDeclaration: return 7;
        case SyntaxKind::LineDirective: return 4;
        case SyntaxKind::LocalScope: return 1;
        case SyntaxKind::LocalVariableDeclaration: return 5;
        case SyntaxKind::LogicType: return 3;
        case SyntaxKind::LogicalAndExpression: return 4;
        case SyntaxKind::LogicalEquivalenceExpression: return 4;
        case SyntaxKind::LogicalImplicationExpression: return 4;
        case SyntaxKind::LogicalLeftShiftAssignmentExpression: return 4;
        case SyntaxKind::LogicalOrExpression: return 4;
        case SyntaxKind::LogicalRightShiftAssignmentExpression: return 4;
        case SyntaxKind::LogicalShiftLeftExpression: return 4;
        case SyntaxKind::LogicalShiftRightExpression: return 4;
        case SyntaxKind::LongIntType: return 3;
        case SyntaxKind::LoopConstraint: return 3;
        case SyntaxKind::LoopGenerate: return 13;
        case SyntaxKind::LoopStatement: return 7;
        case SyntaxKind::MacroActualArgument: return 1;
        case SyntaxKind::MacroActualArgumentList: return 3;
        case SyntaxKind::MacroArgumentDefault: return 2;
        case SyntaxKind::MacroFormalArgument: return 2;
        case SyntaxKind::MacroFormalArgumentList: return 3;
        case SyntaxKind::MacroUsage: return 2;
        case SyntaxKind::MatchesClause: return 2;
        case SyntaxKind::MemberAccessExpression: return 3;
        case SyntaxKind::MinTypMaxExpression: return 5;
        case SyntaxKind::ModAssignmentExpression: return 4;
        case SyntaxKind::ModExpression: return 4;
        case SyntaxKind::ModportClockingPort: return 3;
        case SyntaxKind::ModportDeclaration: return 4;
        case SyntaxKind::ModportExplicitPort: return 5;
        case SyntaxKind::ModportItem: return 2;
        case SyntaxKind::ModportNamedPort: return 1;
        case SyntaxKind::ModportSimplePortList: return 3;
        case SyntaxKind::ModportSubroutinePort: return 1;
        case SyntaxKind::ModportSubroutinePortList: return 3;
        case SyntaxKind::ModuleDeclaration: return 5;
        case SyntaxKind::ModuleHeader: return 7;
        case SyntaxKind::MultipleConcatenationExpression: return 4;
        case SyntaxKind::MultiplyAssignmentExpression: return 4;
        case SyntaxKind::MultiplyExpression: return 4;
        case SyntaxKind::NameValuePragmaExpression: return 3;
        case SyntaxKind::NamedArgument: return 5;
        case SyntaxKind::NamedBlockClause: return 2;
        case SyntaxKind::NamedLabel: return 2;
        case SyntaxKind::NamedParamAssignment: return 5;
        case SyntaxKind::NamedPortConnection: return 6;
        case SyntaxKind::NamedStructurePatternMember: return 3;
        case SyntaxKind::NamedType: return 1;
        case SyntaxKind::NetAlias: return 4;
        case SyntaxKind::NetDeclaration: return 8;
        case SyntaxKind::NetPortHeader: return 3;
        case SyntaxKind::NetTypeDeclaration: return 6;
        case SyntaxKind::NewArrayExpression: return 5;
        case SyntaxKind::NewClassExpression: return 2;
        case SyntaxKind::NoUnconnectedDriveDirective: return 1;
        case SyntaxKind::NonAnsiPortList: return 3;
        case SyntaxKind::NonAnsiUdpPortList: return 4;
        case SyntaxKind::NonblockingAssignmentExpression: return 4;
        case SyntaxKind::NonblockingEventTriggerStatement: return 6;
        case SyntaxKind::NullLiteralExpression: return 1;
        case SyntaxKind::NumberPragmaExpression: return 3;
        case SyntaxKind::OneStepDelay: return 2;
        case SyntaxKind::OpenRangeExpression: return 5;
        case SyntaxKind::OpenRangeList: return 3;
        case SyntaxKind::OrAssignmentExpression: return 4;
        case SyntaxKind::OrPropertyExpr: return 3;
        case SyntaxKind::OrSequenceExpr: return 3;
        case SyntaxKind::OrderedArgument: return 1;
        case SyntaxKind::OrderedParamAssignment: return 1;
        case SyntaxKind::OrderedPortConnection: return 2;
        case SyntaxKind::OrderedStructurePatternMember: return 1;
        case SyntaxKind::PackageDeclaration: return 5;
        case SyntaxKind::PackageExportAllDeclaration: return 6;
        case SyntaxKind::PackageExportDeclaration: return 4;
        case SyntaxKind::PackageHeader: return 7;
        case SyntaxKind::PackageImportDeclaration: return 4;
        case SyntaxKind::PackageImportItem: return 3;
        case SyntaxKind::ParallelBlockStatement: return 7;
        case SyntaxKind::ParameterDeclaration: return 3;
        case SyntaxKind::ParameterDeclarationStatement: return 3;
        case SyntaxKind::ParameterPortList: return 4;
        case SyntaxKind::ParameterValueAssignment: return 4;
        case SyntaxKind::ParenExpressionList: return 3;
        case SyntaxKind::ParenPragmaExpression: return 3;
        case SyntaxKind::ParenthesizedBinsSelectExpr: return 3;
        case SyntaxKind::ParenthesizedEventExpression: return 3;
        case SyntaxKind::ParenthesizedExpression: return 3;
        case SyntaxKind::ParenthesizedPattern: return 3;
        case SyntaxKind::ParenthesizedPropertyExpr: return 4;
        case SyntaxKind::ParenthesizedSequenceExpr: return 5;
        case SyntaxKind::PathDeclaration: return 7;
        case SyntaxKind::PathDescription: return 7;
        case SyntaxKind::PatternCaseItem: return 5;
        case SyntaxKind::PortConcatenation: return 3;
        case SyntaxKind::PortDeclaration: return 4;
        case SyntaxKind::PortReference: return 2;
        case SyntaxKind::PostdecrementExpression: return 3;
        case SyntaxKind::PostincrementExpression: return 3;
        case SyntaxKind::PowerExpression: return 4;
        case SyntaxKind::PragmaDirective: return 3;
        case SyntaxKind::PrimaryBlockEventExpression: return 2;
        case SyntaxKind::PrimitiveInstantiation: return 6;
        case SyntaxKind::ProceduralAssignStatement: return 5;
        case SyntaxKind::ProceduralDeassignStatement: return 5;
        case SyntaxKind::ProceduralForceStatement: return 5;
        case SyntaxKind::ProceduralReleaseStatement: return 5;
        case SyntaxKind::Production: return 6;
        case SyntaxKind::ProgramDeclaration: return 5;
        case SyntaxKind::ProgramHeader: return 7;
        case SyntaxKind::PropertyDeclaration: return 10;
        case SyntaxKind::PropertySpec: return 3;
        case SyntaxKind::PropertyType: return 1;
        case SyntaxKind::PullStrength: return 3;
        case SyntaxKind::PulseStyleDeclaration: return 4;
        case SyntaxKind::QueueDimensionSpecifier: return 2;
        case SyntaxKind::RandCaseItem: return 3;
        case SyntaxKind::RandCaseStatement: return 5;
        case SyntaxKind::RandJoinClause: return 3;
        case SyntaxKind::RandSequenceStatement: return 8;
        case SyntaxKind::RangeCoverageBinInitializer: return 2;
        case SyntaxKind::RangeDimensionSpecifier: return 1;
        case SyntaxKind::RealLiteralExpression: return 1;
        case SyntaxKind::RealTimeType: return 1;
        case SyntaxKind::RealType: return 1;
        case SyntaxKind::RegType: return 3;
        case SyntaxKind::RepeatedEventControl: return 5;
        case SyntaxKind::ReplicatedAssignmentPattern: return 6;
        case SyntaxKind::ResetAllDirective: return 1;
        case SyntaxKind::RestrictPropertyStatement: return 8;
        case SyntaxKind::ReturnStatement: return 5;
        case SyntaxKind::RootScope: return 1;
        case SyntaxKind::RsCase: return 6;
        case SyntaxKind::RsCodeBlock: return 3;
        case SyntaxKind::RsElseClause: return 2;
        case SyntaxKind::RsIfElse: return 6;
        case SyntaxKind::RsProdItem: return 2;
        case SyntaxKind::RsRepeat: return 5;
        case SyntaxKind::RsRule: return 3;
        case SyntaxKind::RsWeightClause: return 3;
        case SyntaxKind::SUntilPropertyExpr: return 3;
        case SyntaxKind::SUntilWithPropertyExpr: return 3;
        case SyntaxKind::ScopedName: return 3;
        case SyntaxKind::SequenceDeclaration: return 10;
        case SyntaxKind::SequenceMatchList: return 2;
        case SyntaxKind::SequenceRepetition: return 4;
        case SyntaxKind::SequenceType: return 1;
        case SyntaxKind::SequentialBlockStatement: return 7;
        case SyntaxKind::ShortIntType: return 3;
        case SyntaxKind::ShortRealType: return 1;
        case SyntaxKind::SignalEventExpression: return 3;
        case SyntaxKind::SignedCastExpression: return 3;
        case SyntaxKind::SimpleAssignmentPattern: return 3;
        case SyntaxKind::SimpleBinsSelectExpr: return 2;
        case SyntaxKind::SimplePathSuffix: return 1;
        case SyntaxKind::SimplePragmaExpression: return 1;
        case SyntaxKind::SimplePropertyExpr: return 1;
        case SyntaxKind::SimpleRangeSelect: return 3;
        case SyntaxKind::SimpleSequenceExpr: return 2;
        case SyntaxKind::SolveBeforeConstraint: return 5;
        case SyntaxKind::SpecifyBlock: return 4;
        case SyntaxKind::SpecparamDeclaration: return 5;
        case SyntaxKind::SpecparamDeclarator: return 3;
        case SyntaxKind::StandardCaseItem: return 3;
        case SyntaxKind::StandardPropertyCaseItem: return 4;
        case SyntaxKind::StandardRsCaseItem: return 4;
        case SyntaxKind::StreamExpression: return 2;
        case SyntaxKind::StreamExpressionWithRange: return 2;
        case SyntaxKind::StreamingConcatenationExpression: return 7;
        case SyntaxKind::StringLiteralExpression: return 1;
        case SyntaxKind::StringType: return 1;
        case SyntaxKind::StrongWeakPropertyExpr: return 4;
        case SyntaxKind::StructType: return 8;
        case SyntaxKind::StructUnionMember: return 5;
        case SyntaxKind::StructurePattern: return 3;
        case SyntaxKind::StructuredAssignmentPattern: return 3;
        case SyntaxKind::SubtractAssignmentExpression: return 4;
        case SyntaxKind::SubtractExpression: return 4;
        case SyntaxKind::SuperHandle: return 1;
        case SyntaxKind::SystemName: return 1;
        case SyntaxKind::SystemTimingCheck: return 6;
        case SyntaxKind::TaggedPattern: return 3;
        case SyntaxKind::TaggedUnionExpression: return 3;
        case SyntaxKind::TaskDeclaration: return 6;
        case SyntaxKind::ThisHandle: return 1;
        case SyntaxKind::ThroughoutSequenceExpr: return 3;
        case SyntaxKind::TimeLiteralExpression: return 1;
        case SyntaxKind::TimeScaleDirective: return 4;
        case SyntaxKind::TimeType: return 3;
        case SyntaxKind::TimeUnitsDeclaration: return 5;
        case SyntaxKind::TimingCheckCondition: return 2;
        case SyntaxKind::TimingCheckEvent: return 4;
        case SyntaxKind::TimingControlExpression: return 2;
        case SyntaxKind::TimingControlStatement: return 4;
        case SyntaxKind::TransListCoverageBinInitializer: return 1;
        case SyntaxKind::TransRange: return 2;
        case SyntaxKind::TransRepeatRange: return 4;
        case SyntaxKind::TransSet: return 3;
        case SyntaxKind::TypeAssignment: return 2;
        case SyntaxKind::TypeParameterDeclaration: return 3;
        case SyntaxKind::TypeReference: return 4;
        case SyntaxKind::TypedefDeclaration: return 6;
        case SyntaxKind::UdpBody: return 5;
        case SyntaxKind::UdpDeclaration: return 7;
        case SyntaxKind::UdpEdgeIndicator: return 4;
        case SyntaxKind::UdpEntry: return 8;
        case SyntaxKind::UdpInitialStmt: return 5;
        case SyntaxKind::UdpInputPortDecl: return 3;
        case SyntaxKind::UdpOutputPortDecl: return 5;
        case SyntaxKind::UnaryBinsSelectExpr: return 2;
        case SyntaxKind::UnaryBitwiseAndExpression: return 3;
        case SyntaxKind::UnaryBitwiseNandExpression: return 3;
        case SyntaxKind::UnaryBitwiseNorExpression: return 3;
        case SyntaxKind::UnaryBitwiseNotExpression: return 3;
        case SyntaxKind::UnaryBitwiseOrExpression: return 3;
        case SyntaxKind::UnaryBitwiseXnorExpression: return 3;
        case SyntaxKind::UnaryBitwiseXorExpression: return 3;
        case SyntaxKind::UnaryLogicalNotExpression: return 3;
        case SyntaxKind::UnaryMinusExpression: return 3;
        case SyntaxKind::UnaryPlusExpression: return 3;
        case SyntaxKind::UnaryPredecrementExpression: return 3;
        case SyntaxKind::UnaryPreincrementExpression: return 3;
        case SyntaxKind::UnaryPropertyExpr: return 2;
        case SyntaxKind::UnarySelectPropertyExpr: return 5;
        case SyntaxKind::UnbasedUnsizedLiteralExpression: return 1;
        case SyntaxKind::UnconnectedDriveDirective: return 2;
        case SyntaxKind::UndefDirective: return 2;
        case SyntaxKind::UndefineAllDirective: return 1;
        case SyntaxKind::UnionType: return 8;
        case SyntaxKind::UniquenessConstraint: return 3;
        case SyntaxKind::UnitScope: return 1;
        case SyntaxKind::UntilPropertyExpr: return 3;
        case SyntaxKind::UntilWithPropertyExpr: return 3;
        case SyntaxKind::Untyped: return 1;
        case SyntaxKind::UserDefinedNetDeclaration: return 5;
        case SyntaxKind::VariableDimension: return 3;
        case SyntaxKind::VariablePattern: return 2;
        case SyntaxKind::VariablePortHeader: return 4;
        case SyntaxKind::VirtualInterfaceType: return 5;
        case SyntaxKind::VoidCastedCallStatement: return 8;
        case SyntaxKind::VoidType: return 1;
        case SyntaxKind::WaitForkStatement: return 5;
        case SyntaxKind::WaitOrderStatement: return 7;
        case SyntaxKind::WaitStatement: return 7;
        case SyntaxKind::WildcardDimensionSpecifier: return 1;
        case SyntaxKind::WildcardEqualityExpression: return 4;
        case SyntaxKind::WildcardInequalityExpression: return 4;
        case SyntaxKind::WildcardLiteralExpression: return 1;
        case SyntaxKind::WildcardPattern: return 1;
        case SyntaxKind::WildcardPortConnection: return 2;
        case SyntaxKind::WildcardPortList: return 3;
        case SyntaxKind::WildcardUdpPortList: return 4;
        case SyntaxKind::WithClause: return 4;
        case SyntaxKind::WithFunctionClause: return 2;
        case SyntaxKind::WithFunctionSample: return 4;
        case SyntaxKind::WithinSequenceExpr: return 3;
        case SyntaxKind::XorAssignmentExpression: return 4;
    }
    ASSUME_UNREACHABLE;
}